

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

uint16 crnd::dxt1_block::pack_color(uint32 r,uint32 g,uint32 b,bool scaled,uint32 bias)

{
  uint uVar1;
  undefined7 in_register_00000009;
  uint uVar2;
  uint uVar3;
  
  if (0xfe < (int)r) {
    r = 0xff;
  }
  uVar2 = 0;
  if ((int)r < 1) {
    r = uVar2;
  }
  if (0xfe < (int)g) {
    g = 0xff;
  }
  if ((int)g < 1) {
    g = uVar2;
  }
  uVar3 = 0xff;
  if ((int)b < 0xff) {
    uVar3 = b;
  }
  if ((int)uVar3 < 1) {
    uVar3 = uVar2;
  }
  if ((int)CONCAT71(in_register_00000009,scaled) != 0) {
    r = (r * 0x1f + bias) / 0xff;
    uVar3 = (uVar3 * 0x1f + bias) / 0xff;
    g = (g * 0x3f + bias) / 0xff;
  }
  if (0x1e < r) {
    r = 0x1f;
  }
  uVar2 = 0x3f;
  if (g < 0x3f) {
    uVar2 = g;
  }
  uVar1 = 0x1f;
  if (uVar3 < 0x1f) {
    uVar1 = uVar3;
  }
  return (ushort)(r << 0xb) | (ushort)(uVar2 << 5) | (ushort)uVar1;
}

Assistant:

uint16 dxt1_block::pack_color(uint32 r, uint32 g, uint32 b, bool scaled, uint32 bias)
    {
        return pack_color(color_quad_u8(r, g, b, 0), scaled, bias);
    }